

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_get_http_var(mg_str *buf,char *name,char *dst,size_t dst_len)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t len;
  void *pvVar6;
  long lVar7;
  char *pcVar8;
  
  if (dst_len == 0 || dst == (char *)0x0) {
    iVar4 = -2;
  }
  else {
    pcVar8 = buf->p;
    if ((name == (char *)0x0 || pcVar8 == (char *)0x0) || (sVar1 = buf->len, sVar1 == 0)) {
      *dst = '\0';
      iVar4 = -1;
    }
    else {
      len = strlen(name);
      pcVar8 = pcVar8 + sVar1;
      *dst = '\0';
      pcVar2 = buf->p;
      iVar4 = -1;
      for (lVar7 = 0; pcVar2 + lVar7 + len < pcVar8; lVar7 = lVar7 + 1) {
        if ((((lVar7 == 0) || (pcVar2[lVar7 + -1] == '&')) && (pcVar2[lVar7 + len] == '=')) &&
           (iVar3 = mg_ncasecmp(name,pcVar2 + lVar7,len), iVar3 == 0)) {
          pvVar6 = memchr(pcVar2 + lVar7 + len + 1,0x26,
                          (size_t)(pcVar8 + ((~len - (long)pcVar2) - lVar7)));
          iVar4 = (int)pcVar8;
          if (pvVar6 != (void *)0x0) {
            iVar4 = (int)pvVar6;
          }
          uVar5 = mg_url_decode(pcVar2 + lVar7 + len + 1,
                                (iVar4 + ~((int)pcVar2 + (int)len)) - (int)lVar7,dst,(int)dst_len,1)
          ;
          if (uVar5 < 0xfffffffe) {
            return uVar5;
          }
          return -2;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mg_get_http_var(const struct mg_str *buf, const char *name, char *dst,
                    size_t dst_len) {
    const char *p, *e, *s;
    size_t name_len;
    int len;

    if (dst == NULL || dst_len == 0) {
        len = -2;
    } else if (buf->p == NULL || name == NULL || buf->len == 0) {
        len = -1;
        dst[0] = '\0';
    } else {
        name_len = strlen(name);
        e = buf->p + buf->len;
        len = -1;
        dst[0] = '\0';

        for (p = buf->p; p + name_len < e; p++) {
            if ((p == buf->p || p[-1] == '&') && p[name_len] == '=' &&
                !mg_ncasecmp(name, p, name_len)) {
                p += name_len + 1;
                s = (const char *) memchr(p, '&', (size_t) (e - p));
                if (s == NULL) {
                    s = e;
                }
                len = mg_url_decode(p, (size_t) (s - p), dst, dst_len, 1);
                if (len == -1) {
                    len = -2;
                }
                break;
            }
        }
    }

    return len;
}